

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_demangle.h
# Opt level: O1

string * __thiscall cute::demangle_abi_cxx11_(string *__return_storage_ptr__,cute *this,char *name)

{
  cute *__ptr;
  size_t sVar1;
  string *result;
  
  if (this == (cute *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
  }
  else {
    __ptr = (cute *)__cxa_demangle(this,0,0,0);
    if (__ptr != (cute *)0x0) {
      this = __ptr;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen((char *)this);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,this,this + sVar1);
    free(__ptr);
    cute_impl_demangle::patchresultforstring(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangle(char const *name){
	if (!name) return "unknown";
	std::string result(cute_impl_demangle::plain_demangle(name));
#if defined(_LIBCPP_NAMESPACE) || defined(_GLIBCXX_USE_CXX11_ABI)
	cute_impl_demangle::patchresultforstring(result);
#endif
	return result;
}